

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

double __thiscall minja::Value::get<double>(Value *this)

{
  bool bVar1;
  runtime_error *this_00;
  double dVar2;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = is_primitive(this);
  if (bVar1) {
    dVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::get_impl<double,_0>(&this->primitive_);
    return dVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  dump_abi_cxx11_(&sStack_58,this,-1,false);
  std::operator+(&local_38,"get<T> not defined for this value type: ",&sStack_58);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get() const {
    if (is_primitive()) return primitive_.get<T>();
    throw std::runtime_error("get<T> not defined for this value type: " + dump());
  }